

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_36::HttpOutputStream::queueWrite(HttpOutputStream *this,String *content)

{
  Promise<void> *params;
  PromiseNode *pPVar1;
  PromiseArena *pPVar2;
  SourceLocation location;
  OwnPromiseNode OVar3;
  void *pvVar4;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:2386:34)>
  *location_00;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_80;
  OwnPromiseNode local_78;
  code *local_70;
  OwnPromiseNode local_68;
  anon_class_32_2_06e25726_for_func local_60;
  undefined *local_40;
  undefined *puStack_38;
  undefined8 local_30;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  
  params = &this->writeQueue;
  local_60.content.content.ptr = (content->content).ptr;
  local_60.content.content.size_ = (content->content).size_;
  local_60.content.content.disposer = (content->content).disposer;
  (content->content).ptr = (char *)0x0;
  (content->content).size_ = 0;
  local_70 = kj::_::
             SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:2386:34)>
             ::anon_class_32_2_06e25726_for_func::operator();
  pPVar1 = (this->writeQueue).super_PromiseBase.node.ptr;
  pPVar2 = (pPVar1->super_PromiseArenaMember).arena;
  local_60.this = this;
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)pPVar1 - (long)pPVar2) < 0x40) {
    pvVar4 = operator_new(0x400);
    location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:2386:34)>
                   *)((long)pvVar4 + 0x3c0);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::HttpOutputStream::queueWrite(kj::String)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::HttpOutputStream::queueWrite(kj::String)::_lambda()_1_,void*&>
              (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)params,&local_60,
               &local_70);
    *(void **)((long)pvVar4 + 0x3c8) = pvVar4;
  }
  else {
    (pPVar1->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:2386:34)>
                   *)(pPVar1 + -4);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::HttpOutputStream::queueWrite(kj::String)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::HttpOutputStream::queueWrite(kj::String)::_lambda()_1_,void*&>
              (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)params,&local_60,
               &local_70);
    pPVar1[-4].super_PromiseArenaMember.arena = pPVar2;
  }
  local_40 = &DAT_003d3151;
  puStack_38 = &DAT_003d31b0;
  local_30 = 0x4c0000058b;
  location.function = &DAT_003d31b0;
  location.fileName = &DAT_003d3151;
  location.lineNumber = 0x58b;
  location.columnNumber = 0x4c;
  local_78.ptr = (PromiseNode *)location_00;
  kj::_::maybeChain<void>(&local_68,(Promise<void> *)&local_78,location);
  OVar3.ptr = local_68.ptr;
  local_68.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_68);
  local_80.ptr = OVar3.ptr;
  local_28.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_28);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_78);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)params,&local_80);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_80);
  Array<char>::~Array(&local_60.content.content);
  return;
}

Assistant:

void queueWrite(kj::String content) {
    // We only use queueWrite() in cases where we can take ownership of the write buffer, and where
    // it is convenient if we can return `void` rather than a promise.  In particular, this is used
    // to write headers and chunk boundaries. Writes of application data do not go into
    // `writeQueue` because this would prevent cancellation. Instead, they wait until `writeQueue`
    // is empty, then they make the write directly, using `writeInProgress` to detect and block
    // concurrent writes.

    writeQueue = writeQueue.then([this,content=kj::mv(content)]() mutable {
      auto promise = inner.write(content.asBytes());
      return promise.attach(kj::mv(content));
    });
  }